

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

ssize_t bid_get_line(archive_read_filter *filter,uchar **b,ssize_t *avail,ssize_t *ravail,
                    ssize_t *nl,size_t *nbytes_read)

{
  long lVar1;
  bool bVar2;
  uchar *puVar3;
  long lVar4;
  bool bVar5;
  ssize_t tested;
  size_t nbytes_req;
  ssize_t diff;
  long lStack_48;
  int quit;
  ssize_t len;
  size_t *nbytes_read_local;
  ssize_t *nl_local;
  ssize_t *ravail_local;
  ssize_t *avail_local;
  uchar **b_local;
  archive_read_filter *filter_local;
  
  bVar2 = false;
  if (*avail == 0) {
    *nl = 0;
    lStack_48 = 0;
    lVar4 = lStack_48;
  }
  else {
    lVar4 = get_line(*b,*avail,nl);
  }
  while( true ) {
    lStack_48 = lVar4;
    bVar5 = false;
    if (((*nl == 0) && (bVar5 = false, lStack_48 == *avail)) && (bVar5 = false, !bVar2)) {
      bVar5 = *nbytes_read < 0x20000;
    }
    if (!bVar5) break;
    lVar4 = *ravail;
    lVar1 = *avail;
    tested = *ravail + 0x3ffU & 0xfffffc00;
    if ((ulong)tested < *ravail + 0xa0U) {
      tested = tested << 1;
    }
    puVar3 = (uchar *)__archive_read_filter_ahead(filter,tested,avail);
    *b = puVar3;
    if (*b == (uchar *)0x0) {
      if (*avail <= *ravail) {
        return 0;
      }
      puVar3 = (uchar *)__archive_read_filter_ahead(filter,*avail,avail);
      *b = puVar3;
      bVar2 = true;
    }
    *nbytes_read = *avail;
    *ravail = *avail;
    *b = *b + (lVar4 - lVar1);
    *avail = *avail - (lVar4 - lVar1);
    lVar4 = get_line(*b + lStack_48,*avail - lStack_48,nl);
    if (-1 < lVar4) {
      lVar4 = lVar4 + lStack_48;
    }
  }
  return lStack_48;
}

Assistant:

static ssize_t
bid_get_line(struct archive_read_filter *filter,
    const unsigned char **b, ssize_t *avail, ssize_t *ravail,
    ssize_t *nl, size_t* nbytes_read)
{
	ssize_t len;
	int quit;
	
	quit = 0;
	if (*avail == 0) {
		*nl = 0;
		len = 0;
	} else
		len = get_line(*b, *avail, nl);

	/*
	 * Read bytes more while it does not reach the end of line.
	 */
	while (*nl == 0 && len == *avail && !quit &&
	    *nbytes_read < UUENCODE_BID_MAX_READ) {
		ssize_t diff = *ravail - *avail;
		size_t nbytes_req = (*ravail+1023) & ~1023U;
		ssize_t tested;

		/* Increase reading bytes if it is not enough to at least
		 * new two lines. */
		if (nbytes_req < (size_t)*ravail + 160)
			nbytes_req <<= 1;

		*b = __archive_read_filter_ahead(filter, nbytes_req, avail);
		if (*b == NULL) {
			if (*ravail >= *avail)
				return (0);
			/* Reading bytes reaches the end of a stream. */
			*b = __archive_read_filter_ahead(filter, *avail, avail);
			quit = 1;
		}
		*nbytes_read = *avail;
		*ravail = *avail;
		*b += diff;
		*avail -= diff;
		tested = len;/* Skip some bytes we already determinated. */
		len = get_line(*b + tested, *avail - tested, nl);
		if (len >= 0)
			len += tested;
	}
	return (len);
}